

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void aead_do_encrypt_init(ptls_aead_context_t *_ctx,void *iv,void *aad,size_t aadlen)

{
  int iVar1;
  int blocklen;
  int local_1c;
  
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)iv);
  if (iVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                  ,0x386,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, const void *, const void *, size_t)"
                 );
  }
  if (aadlen != 0) {
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)0x0,&local_1c,(uchar *)aad,
                              (int)aadlen);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                    ,0x38b,
                    "void aead_do_encrypt_init(ptls_aead_context_t *, const void *, const void *, size_t)"
                   );
    }
  }
  return;
}

Assistant:

static void aead_do_encrypt_init(ptls_aead_context_t *_ctx, const void *iv, const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    int ret;

    /* FIXME for performance, preserve the expanded key instead of the raw key */
    ret = EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);

    if (aadlen != 0) {
        int blocklen;
        ret = EVP_EncryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
}